

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomTabStops::read(DomTabStops *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  QStringView tag;
  QStringBuilder<QLatin1String,_const_QStringView_&> *in_stack_ffffffffffffff38;
  QStringBuilder<QLatin1String,_const_QStringView_&> *this_00;
  QLatin1String *in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff48;
  QStringBuilder<QLatin1String,_const_QStringView_&> *pQVar5;
  DomTabStops *pDVar6;
  storage_type_conflict *in_stack_ffffffffffffff68;
  undefined1 local_58 [64];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QStringBuilder<QLatin1String,_const_QStringView_&> *)
            CONCAT44(in_register_00000034,__fd);
  pDVar6 = this;
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x19e5aa);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_0019e730;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      local_18._0_8_ = 0xaaaaaaaaaaaaaaaa;
      local_18._8_8_ = 0xaaaaaaaaaaaaaaaa;
      local_18 = QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s((char16_t *)this_00,(size_t)this);
      QStringView::QStringView<QString,_true>
                ((QStringView *)this,(QString *)CONCAT44(iVar2,in_stack_ffffffffffffff48));
      other.m_data = in_stack_ffffffffffffff68;
      other.m_size = (qsizetype)pDVar6;
      iVar3 = QStringView::compare((QStringView *)in_stack_ffffffffffffff38,other,CaseInsensitive);
      in_stack_ffffffffffffff48 = CONCAT13(iVar3 != 0,(int3)in_stack_ffffffffffffff48) ^ 0xff000000;
      QString::~QString((QString *)0x19e67c);
      if ((in_stack_ffffffffffffff48 & 0x1000000) == 0) {
        pQVar5 = this_00;
        QVar4 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)CONCAT44(iVar2,in_stack_ffffffffffffff48),
                           (size_t)in_stack_ffffffffffffff40);
        in_stack_ffffffffffffff68 = (storage_type_conflict *)QVar4.m_size;
        ::operator+(in_stack_ffffffffffffff40,(QStringView *)this_00);
        ::QStringBuilder::operator_cast_to_QString(this_00);
        QXmlStreamReader::raiseError((QString *)this_00);
        QString::~QString((QString *)0x19e725);
        in_stack_ffffffffffffff38 = this_00;
        this_00 = pQVar5;
      }
      else {
        in_stack_ffffffffffffff40 = (QLatin1String *)&this->m_tabStop;
        QXmlStreamReader::readElementText(local_58,this_00,0);
        QList<QString>::append
                  ((QList<QString> *)in_stack_ffffffffffffff40,(rvalue_ref)in_stack_ffffffffffffff38
                  );
        QString::~QString((QString *)0x19e6be);
      }
    }
  } while (iVar2 != 5);
LAB_0019e730:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomTabStops::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"tabstop"_s, Qt::CaseInsensitive)) {
                m_tabStop.append(reader.readElementText());
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}